

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

int Spl_ManLutMffcSize(Gia_Man_t *p,int iObj,Vec_Int_t *vTemp,Vec_Bit_t *vMarksAnd)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int local_1c;
  
  local_1c = iObj;
  if ((-1 < iObj) && (iObj < p->vMapping2->nSize)) {
    if (p->vMapping2->pArray[(uint)iObj].nSize == 0) {
      __assert_fail("Gia_ObjIsLut2(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                    ,0x1ba,"int Spl_ManLutMffcSize(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *)");
    }
    Gia_ManIncrementTravId(p);
    if ((-1 < (long)local_1c) && (local_1c < p->vMapping2->nSize)) {
      Gia_ManCollectAnds(p,&local_1c,1,vTemp,p->vMapping2->pArray + local_1c);
      uVar4 = vTemp->nSize;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar2 = 0;
      }
      else {
        piVar1 = vTemp->pArray;
        lVar3 = 0;
        uVar2 = 0;
        do {
          uVar4 = piVar1[lVar3];
          if (((int)uVar4 < 0) || (vMarksAnd->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if (((uint)vMarksAnd->pArray[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) == 0) {
            if (((int)uVar2 < 0) || ((int)uVar5 <= (int)uVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar5 = (ulong)uVar2;
            uVar2 = uVar2 + 1;
            piVar1[uVar5] = uVar4;
          }
          lVar3 = lVar3 + 1;
          uVar4 = vTemp->nSize;
          uVar5 = (ulong)(int)uVar4;
        } while (lVar3 < (long)uVar5);
      }
      if ((int)uVar4 < (int)uVar2) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vTemp->nSize = uVar2;
      return uVar2;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Spl_ManLutMffcSize( Gia_Man_t * p, int iObj, Vec_Int_t * vTemp, Vec_Bit_t * vMarksAnd )
{
    int iTemp, i, k = 0;
    assert( Gia_ObjIsLut2(p, iObj) );
//Vec_IntPrint( Gia_ObjLutFanins2(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iObj, 1, vTemp, Gia_ObjLutFanins2(p, iObj) );
    Vec_IntForEachEntry( vTemp, iTemp, i )
        if ( !Vec_BitEntry(vMarksAnd, iTemp) )
            Vec_IntWriteEntry( vTemp, k++, iTemp );
    Vec_IntShrink( vTemp, k );
    return k;
}